

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::UniformValueFloatCase::test(UniformValueFloatCase *this)

{
  CallLogWrapper *this_00;
  GLuint shader;
  GLuint shader_00;
  GLuint program;
  GLint GVar1;
  
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  glu::CallLogWrapper::glShaderSource(this_00,shader,1,&test::testVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(this_00,shader_00,1,&test::testFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  glu::CallLogWrapper::glCompileShader(this_00,shader_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader_00);
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  GVar1 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"floatUniform");
  glu::CallLogWrapper::glUniform1f(this_00,GVar1,1.0);
  verifyUniformValue1f
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             program,GVar1,1.0);
  GVar1 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"float2Uniform");
  glu::CallLogWrapper::glUniform2f(this_00,GVar1,1.0,2.0);
  verifyUniformValue2f
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             program,GVar1,1.0,2.0);
  GVar1 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"float3Uniform");
  glu::CallLogWrapper::glUniform3f(this_00,GVar1,1.0,2.0,3.0);
  verifyUniformValue3f
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             program,GVar1,1.0,2.0,3.0);
  GVar1 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"float4Uniform");
  glu::CallLogWrapper::glUniform4f(this_00,GVar1,1.0,2.0,3.0,4.0);
  verifyUniformValue4f
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             program,GVar1,1.0,2.0,3.0,4.0);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteShader(this_00,shader);
  glu::CallLogWrapper::glDeleteShader(this_00,shader_00);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"#version 300 es\n"
			"uniform highp float floatUniform;\n"
			"uniform highp vec2 float2Uniform;\n"
			"uniform highp vec3 float3Uniform;\n"
			"uniform highp vec4 float4Uniform;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(floatUniform + float2Uniform.x + float3Uniform.x + float4Uniform.x);\n"
			"}\n";
		static const char* testFragSource =
			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 fragColor;"
			"void main (void)\n"
			"{\n"
			"	fragColor = vec4(0.0);\n"
			"}\n";

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &testVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &testFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);
		glUseProgram(program);
		expectError(GL_NO_ERROR);

		GLint location;

		location = glGetUniformLocation(program,"floatUniform");
		glUniform1f(location, 1.0f);
		verifyUniformValue1f(m_testCtx, *this, program, location, 1.0f);

		location = glGetUniformLocation(program,"float2Uniform");
		glUniform2f(location, 1.0f, 2.0f);
		verifyUniformValue2f(m_testCtx, *this, program, location, 1.0f, 2.0f);

		location = glGetUniformLocation(program,"float3Uniform");
		glUniform3f(location, 1.0f, 2.0f, 3.0f);
		verifyUniformValue3f(m_testCtx, *this, program, location, 1.0f, 2.0f, 3.0f);

		location = glGetUniformLocation(program,"float4Uniform");
		glUniform4f(location, 1.0f, 2.0f, 3.0f, 4.0f);
		verifyUniformValue4f(m_testCtx, *this, program, location, 1.0f, 2.0f, 3.0f, 4.0f);

		glUseProgram(0);
		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}